

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestProperty * __thiscall testing::TestResult::GetTestProperty(TestResult *this,int i)

{
  pointer pTVar1;
  char *pcVar2;
  
  if (-1 < i) {
    pTVar1 = (this->test_properties_).
             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (i < (int)((ulong)((long)(this->test_properties_).
                                super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) >> 6)) {
      if ((ulong)(uint)i <
          (ulong)((long)(this->test_properties_).
                        super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 6)) {
        return pTVar1 + (uint)i;
      }
      pcVar2 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      return (TestProperty *)((ulong)(*(long *)(pcVar2 + 0x58) - *(long *)(pcVar2 + 0x50)) >> 6);
    }
  }
  internal::posix::Abort();
}

Assistant:

const TestProperty& TestResult::GetTestProperty(int i) const {
  if (i < 0 || i >= test_property_count())
    internal::posix::Abort();
  return test_properties_.at(i);
}